

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O1

int getopt_next(getopt_context_t *ctx)

{
  char cVar1;
  int iVar2;
  int iVar3;
  getopt_option_type_t gVar4;
  char **ppcVar5;
  char *pcVar6;
  bool bVar7;
  getopt_option_t *pgVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  getopt_option_t *pgVar12;
  long lVar13;
  getopt_option_t *local_58;
  char *local_50;
  
  iVar9 = ctx->current_index;
  iVar2 = ctx->argc;
  if (iVar9 == iVar2) {
    return -1;
  }
  ctx->current_opt_arg = (char *)0x0;
  ppcVar5 = ctx->argv;
  pcVar6 = ppcVar5[iVar9];
  ctx->current_index = iVar9 + 1;
  if ((*pcVar6 != '\0') && (*pcVar6 != '-')) {
    ctx->current_opt_arg = pcVar6;
    return 0x2b;
  }
  cVar1 = pcVar6[1];
  if (cVar1 == '\0') goto LAB_00149da2;
  if (cVar1 == '-') {
LAB_00149c78:
    if (pcVar6[2] == '\0') {
LAB_00149da2:
      ctx->current_opt_arg = pcVar6;
      return 0x21;
    }
    lVar13 = (long)ctx->num_opts;
    if (lVar13 < 1) goto LAB_00149e3c;
    pgVar12 = ctx->opts;
    local_58 = (getopt_option_t *)0x0;
    local_50 = (char *)0x0;
    do {
      lVar13 = lVar13 + -1;
      pcVar11 = pgVar12->name;
      if (pcVar11 == (char *)0x0) {
LAB_00149cd8:
        bVar7 = false;
        pgVar8 = local_58;
      }
      else {
        sVar10 = strlen(pcVar11);
        iVar9 = strncasecmp(pcVar11,pcVar6 + 2,sVar10 & 0xffffffff);
        if (iVar9 != 0) goto LAB_00149cd8;
        bVar7 = true;
        pgVar8 = pgVar12;
        if (0xfffffff9 < pgVar12->type - GETOPT_OPTION_TYPE_FLAG_SET) {
          pcVar11 = pcVar6 + 2 + (sVar10 & 0xffffffff);
          if (*pcVar11 == '=') {
            if (pcVar11[1] == '\0') {
              iVar9 = ctx->current_index;
              if (iVar9 < iVar2) {
                ctx->current_index = iVar9 + 1;
                local_50 = ppcVar5[iVar9];
              }
            }
            else {
              local_50 = pcVar11 + 1;
            }
          }
          else {
            if (*pcVar11 != '\0') goto LAB_00149cd8;
            iVar9 = ctx->current_index;
            if (iVar9 < iVar2) {
              pcVar11 = ppcVar5[iVar9];
              if (*pcVar11 == '=') {
                ctx->current_index = iVar9 + 1;
                if (pcVar11[1] == '\0') {
                  if (iVar9 + 1 < iVar2) {
                    ctx->current_index = iVar9 + 2;
                    local_50 = ppcVar5[(long)iVar9 + 1];
                  }
                }
                else {
                  local_50 = pcVar11 + 1;
                }
              }
              else if (*pcVar11 != '-') {
                ctx->current_index = iVar9 + 1;
                local_50 = pcVar11;
              }
            }
          }
        }
      }
      local_58 = pgVar8;
    } while ((!bVar7) && (pgVar12 = pgVar12 + 1, lVar13 != 0));
  }
  else {
    if (pcVar6[2] != '\0') {
      if (cVar1 != '-') goto LAB_00149da2;
      goto LAB_00149c78;
    }
    lVar13 = (long)ctx->num_opts;
    if (lVar13 < 1) {
LAB_00149e3c:
      local_50 = (char *)0x0;
      local_58 = (getopt_option_t *)0x0;
    }
    else {
      pgVar12 = ctx->opts;
      local_58 = (getopt_option_t *)0x0;
      local_50 = (char *)0x0;
      do {
        lVar13 = lVar13 + -1;
        iVar9 = pgVar12->name_short;
        cVar1 = pcVar6[1];
        if (iVar9 == cVar1) {
          iVar3 = ctx->current_index;
          local_58 = pgVar12;
          if (((iVar3 != iVar2) && (pcVar11 = ppcVar5[iVar3], *pcVar11 != '-')) &&
             (0xfffffff9 < pgVar12->type - GETOPT_OPTION_TYPE_FLAG_SET)) {
            ctx->current_index = iVar3 + 1;
            local_50 = pcVar11;
          }
        }
      } while ((iVar9 != cVar1) && (pgVar12 = pgVar12 + 1, lVar13 != 0));
    }
  }
  if (local_58 == (getopt_option_t *)0x0) {
    ctx->current_opt_arg = pcVar6;
    return 0x3f;
  }
  if (local_50 == (char *)0x0) {
    iVar9 = -1;
    switch(local_58->type) {
    case GETOPT_OPTION_TYPE_NO_ARG:
    case GETOPT_OPTION_TYPE_OPTIONAL:
    case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
    case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
      goto switchD_00149ebd_caseD_0;
    case GETOPT_OPTION_TYPE_REQUIRED:
    case GETOPT_OPTION_TYPE_REQUIRED_INT32:
    case GETOPT_OPTION_TYPE_REQUIRED_FP32:
      ctx->current_opt_arg = local_58->name;
      return 0x21;
    case GETOPT_OPTION_TYPE_FLAG_SET:
      *local_58->flag = local_58->value;
      break;
    case GETOPT_OPTION_TYPE_FLAG_AND:
      *local_58->flag = *local_58->flag & local_58->value;
      break;
    case GETOPT_OPTION_TYPE_FLAG_OR:
      *local_58->flag = *local_58->flag | local_58->value;
      break;
    default:
      goto switchD_00149ebd_default;
    }
    iVar9 = 0;
  }
  else {
    ctx->current_opt_arg = local_50;
    gVar4 = local_58->type;
    if (GETOPT_OPTION_TYPE_FLAG_OR < gVar4) {
      return -1;
    }
    if ((0x78U >> (gVar4 & 0x1f) & 1) != 0) {
      iVar9 = getopt_read_value(ctx,local_58);
      return iVar9;
    }
    if ((0x381U >> (gVar4 & 0x1f) & 1) != 0) {
      ctx->current_opt_arg = (char *)0x0;
      return 0x2b;
    }
switchD_00149ebd_caseD_0:
    iVar9 = local_58->value;
  }
switchD_00149ebd_default:
  return iVar9;
}

Assistant:

int getopt_next( getopt_context_t* ctx )
{
	/* are all options processed? */
	if(ctx->current_index == ctx->argc )
		return -1;

	/* reset opt-arg */
	ctx->current_opt_arg = 0x0;

	const char* curr_token = ctx->argv[ ctx->current_index ];
	
	/* this token has been processed! */
	ctx->current_index++;

	/* check if item is no option */
	if( curr_token[0] && curr_token[0] != '-' )
	{
		ctx->current_opt_arg = curr_token;
		return '+'; /* return '+' as identifier for no option! */
	}
	
	const getopt_option_t* found_opt = 0x0;
	const char* found_arg = 0x0;

	/* short opt */
	if( curr_token[1] != '\0' && curr_token[1] != '-' && curr_token[2] == '\0' )
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const getopt_option_t* opt = ctx->opts + i;

			if( opt->name_short == curr_token[1] )
			{
				found_opt = opt;

				/* if there is an value when: - current_index < argc and value in argv[current_index] do not start with '-' */
				if( ( ( ctx->current_index != ctx->argc) && ( ctx->argv[ctx->current_index][0] != '-' ) ) && 
					  getopt_opt_might_have_arg(opt) )
				{
					found_arg = ctx->argv[ctx->current_index];
					ctx->current_index++; /* next token has been processed aswell! */
				}
				break;
			}
		}
	}
	/* long opt */
	else if(curr_token[1] == '-' && curr_token[2] != '\0')
	{
		int i = 0;
		for( ; i < ctx->num_opts; i++ )
		{
			const char* check_option = curr_token + 2;

			const getopt_option_t* opt = ctx->opts + i;

			if(!opt->name)
				continue;

			unsigned int name_len = (unsigned int)strlen( opt->name );

			if( str_case_cmp_len( opt->name, check_option, name_len ) == 0 )
			{
				check_option += name_len;

				/* find arg if there is any */
				if(getopt_opt_might_have_arg(opt))
				{
					switch( *check_option )
					{
						case '\0':
						{
							if( ctx->current_index < ctx->argc ) /* are there more tokens that can contain the '='? */
							{
								const char* next_token = ctx->argv[ ctx->current_index ];
								if( next_token[0] == '=' )
								{
									ctx->current_index++; /* next token has been processed aswell! */

									if( next_token[1] != '\0' ) /* does this token contain the arg-value? */
										found_arg = next_token + 1;
									else if( ctx->current_index < ctx->argc )
										found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
								}
								else if( next_token[0] != '-' )
								{
									ctx->current_index++; /* next token has been processed aswell! */
									found_arg = next_token;
								}
							}
						}
						break;
						case '=':
							if( check_option[1] != '\0' )
								found_arg = check_option + 1;
							else if( ctx->current_index < ctx->argc )
								found_arg = ctx->argv[ ctx->current_index++ ]; /* next token has been processed aswell! */
						break;
						default:
							/* not found, matched for example --test but it was --testing*/
							continue;
					}
				}

				found_opt = opt;
				break;
			}
		}
	}
	/* malformed opt "-", "-xyz" or "--" */
	else
	{
		ctx->current_opt_arg = curr_token;
		return '!';
	}

	/* found no matching option! */
	if(found_opt == 0x0)
	{
		ctx->current_opt_arg = curr_token;
		return '?';
	}

	if(found_arg != 0x0)
	{
		ctx->current_opt_arg = found_arg;

		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET:
			case GETOPT_OPTION_TYPE_FLAG_AND:
			case GETOPT_OPTION_TYPE_FLAG_OR:
			case GETOPT_OPTION_TYPE_NO_ARG:
				/* these types should have no argument, usage error! */
				ctx->current_opt_arg = 0x0;
				return '+';

			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_REQUIRED:
				return found_opt->value;
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				return getopt_read_value(ctx, found_opt);
		}
	}
	/* no argument found */
	else
	{
		switch(found_opt->type)
		{
			case GETOPT_OPTION_TYPE_FLAG_SET: *found_opt->flag  = found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_AND: *found_opt->flag &= found_opt->value; return 0;
			case GETOPT_OPTION_TYPE_FLAG_OR:  *found_opt->flag |= found_opt->value; return 0; /* zero is "a flag was set!" */
			
			case GETOPT_OPTION_TYPE_NO_ARG:
			case GETOPT_OPTION_TYPE_OPTIONAL:
			case GETOPT_OPTION_TYPE_OPTIONAL_INT32:
			case GETOPT_OPTION_TYPE_OPTIONAL_FP32:
				return found_opt->value;

			/* the option requires an argument! (--option=arg, -o arg) */
			case GETOPT_OPTION_TYPE_REQUIRED:
			case GETOPT_OPTION_TYPE_REQUIRED_INT32:
			case GETOPT_OPTION_TYPE_REQUIRED_FP32:
				ctx->current_opt_arg = found_opt->name;
				return '!';
		}
	}

 	return -1;
}